

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetConstant
          (ConstantManager *this,Type *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids)

{
  bool bVar1;
  Constant *local_50;
  unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
  local_38;
  unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
  cst;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids_local;
  Type *type_local;
  ConstantManager *this_local;
  
  cst._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Constant_*,_std::default_delete<spvtools::opt::analysis::Constant>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Constant_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )literal_words_or_ids;
  CreateConstant((ConstantManager *)&stack0xffffffffffffffd0,(Type *)this,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)type);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffd0);
  if (bVar1) {
    std::
    unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
    ::unique_ptr(&local_38,
                 (unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
                  *)&stack0xffffffffffffffd0);
    local_50 = RegisterConstant(this,&local_38);
    std::
    unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
    ::~unique_ptr(&local_38);
  }
  else {
    local_50 = (Constant *)0x0;
  }
  std::
  unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
                 *)&stack0xffffffffffffffd0);
  return local_50;
}

Assistant:

const Constant* ConstantManager::GetConstant(
    const Type* type, const std::vector<uint32_t>& literal_words_or_ids) {
  auto cst = CreateConstant(type, literal_words_or_ids);
  return cst ? RegisterConstant(std::move(cst)) : nullptr;
}